

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::BinaryWriterSpec::WriteCommands(BinaryWriterSpec *this)

{
  bool bVar1;
  Command *pCVar2;
  const_reference this_00;
  pointer command_00;
  ModuleCommand *pMVar3;
  ulong uVar4;
  ActionCommandBase<(wabt::CommandType)1> *pAVar5;
  char *pcVar6;
  type pSVar7;
  AssertTrapCommandBase<(wabt::CommandType)11> *pAVar8;
  pointer pAVar9;
  type pAVar10;
  int __c;
  size_type extraout_RDX;
  Var *loc;
  string_view sVar11;
  AssertTrapCommandBase<(wabt::CommandType)11> *assert_exhaustion_command;
  AssertTrapCommandBase<(wabt::CommandType)10> *local_158;
  AssertTrapCommandBase<(wabt::CommandType)10> *assert_trap_command;
  ActionCommandBase<(wabt::CommandType)9> *assert_return_arithmetic_nan_command;
  ActionCommandBase<(wabt::CommandType)8> *assert_return_canonical_nan_command;
  AssertReturnCommand *assert_return_command;
  AssertModuleCommand<(wabt::CommandType)6> *local_128;
  AssertModuleCommand<(wabt::CommandType)6> *assert_uninstantiable_command;
  AssertModuleCommand<(wabt::CommandType)5> *local_110;
  AssertModuleCommand<(wabt::CommandType)5> *assert_unlinkable_command;
  AssertModuleCommand<(wabt::CommandType)4> *local_f8;
  AssertModuleCommand<(wabt::CommandType)4> *assert_invalid_command;
  AssertModuleCommand<(wabt::CommandType)3> *local_e0;
  AssertModuleCommand<(wabt::CommandType)3> *assert_malformed_command;
  Var *local_c8;
  Var *var;
  RegisterCommand *register_command;
  Action *action;
  string_view local_a0;
  string_view local_90;
  string_view local_80 [2];
  undefined1 local_60 [8];
  string filename;
  Module *module;
  Command *command;
  size_t i;
  undefined1 auStack_20 [4];
  Index last_module_index;
  BinaryWriterSpec *local_10;
  BinaryWriterSpec *this_local;
  
  local_10 = this;
  Stream::Writef(this->json_stream_,"{\"source_filename\": ");
  string_view::string_view((string_view *)auStack_20,&this->source_filename_);
  WriteEscapedString(this,_auStack_20);
  Stream::Writef(this->json_stream_,",\n \"commands\": [\n");
  i._4_4_ = -1;
  command = (Command *)0x0;
  do {
    pCVar2 = (Command *)
             std::
             vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
             ::size(&this->script_->commands);
    if (pCVar2 <= command) {
      Stream::Writef(this->json_stream_,"]}\n");
      return;
    }
    this_00 = std::
              vector<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>,_std::allocator<std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>_>_>
              ::operator[](&this->script_->commands,(size_type)command);
    command_00 = std::unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_>::get(this_00);
    if (command != (Command *)0x0) {
      WriteSeparator(this);
      Stream::Writef(this->json_stream_,"\n");
    }
    Stream::Writef(this->json_stream_,"  {");
    WriteCommandType(this,command_00);
    WriteSeparator(this);
    switch(command_00->type) {
    case First:
      pMVar3 = cast<wabt::ModuleCommand,wabt::Command>(command_00);
      filename.field_2._8_8_ = &pMVar3->module;
      (anonymous_namespace)::BinaryWriterSpec::GetModuleFilename_abi_cxx11_
                ((string *)local_60,this,kWasmExtension);
      WriteLocation(this,(Location *)filename.field_2._8_8_);
      WriteSeparator(this);
      uVar4 = std::__cxx11::string::empty((string *)(filename.field_2._8_8_ + 0x20));
      if ((uVar4 & 1) == 0) {
        WriteKey(this,"name");
        string_view::string_view(local_80,(string *)(filename.field_2._8_8_ + 0x20));
        WriteEscapedString(this,local_80[0]);
        WriteSeparator(this);
      }
      WriteKey(this,"filename");
      string_view::string_view(&local_a0,(string *)local_60);
      sVar11.size_ = extraout_RDX;
      sVar11.data_ = (char *)local_a0.size_;
      sVar11 = GetBasename((wabt *)local_a0.data_,sVar11);
      local_90 = sVar11;
      WriteEscapedString(this,sVar11);
      string_view::string_view((string_view *)&action,(string *)local_60);
      WriteModule(this,_action,(Module *)filename.field_2._8_8_);
      this->num_modules_ = this->num_modules_ + 1;
      i._4_4_ = (int)command;
      std::__cxx11::string::~string((string *)local_60);
      break;
    case Action:
      pAVar5 = cast<wabt::ActionCommandBase<(wabt::CommandType)1>,wabt::Command>(command_00);
      register_command =
           (RegisterCommand *)
           std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                     (&pAVar5->action);
      WriteLocation(this,&((type)register_command)->loc);
      WriteSeparator(this);
      WriteAction(this,(Action *)register_command);
      WriteSeparator(this);
      WriteKey(this,"expected");
      WriteActionResultType(this,(Action *)register_command);
      break;
    case Register:
      var = (Var *)cast<wabt::RegisterCommand,wabt::Command>(command_00);
      loc = &((RegisterCommand *)var)->var;
      local_c8 = loc;
      WriteLocation(this,&loc->loc);
      WriteSeparator(this);
      bVar1 = Var::is_name(local_c8);
      if (bVar1) {
        WriteKey(this,"name");
        WriteVar(this,local_c8);
        WriteSeparator(this);
      }
      else {
        pcVar6 = Var::index(local_c8,(char *)loc,__c);
        if ((int)pcVar6 != i._4_4_) {
          __assert_fail("var.index() == last_module_index",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer-spec.cc"
                        ,0x18c,"void wabt::(anonymous namespace)::BinaryWriterSpec::WriteCommands()"
                       );
        }
      }
      WriteKey(this,"as");
      string_view::string_view
                ((string_view *)&assert_malformed_command,(string *)&(var->loc).field_1.field_0);
      WriteEscapedString(this,_assert_malformed_command);
      break;
    case AssertMalformed:
      local_e0 = cast<wabt::AssertModuleCommand<(wabt::CommandType)3>,wabt::Command>(command_00);
      pSVar7 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::
               operator*(&local_e0->module);
      string_view::string_view((string_view *)&assert_invalid_command,&local_e0->text);
      WriteInvalidModule(this,pSVar7,_assert_invalid_command);
      this->num_modules_ = this->num_modules_ + 1;
      break;
    case AssertInvalid:
      local_f8 = cast<wabt::AssertModuleCommand<(wabt::CommandType)4>,wabt::Command>(command_00);
      pSVar7 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::
               operator*(&local_f8->module);
      string_view::string_view((string_view *)&assert_unlinkable_command,&local_f8->text);
      WriteInvalidModule(this,pSVar7,_assert_unlinkable_command);
      this->num_modules_ = this->num_modules_ + 1;
      break;
    case AssertUnlinkable:
      local_110 = cast<wabt::AssertModuleCommand<(wabt::CommandType)5>,wabt::Command>(command_00);
      pSVar7 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::
               operator*(&local_110->module);
      string_view::string_view((string_view *)&assert_uninstantiable_command,&local_110->text);
      WriteInvalidModule(this,pSVar7,_assert_uninstantiable_command);
      this->num_modules_ = this->num_modules_ + 1;
      break;
    case AssertUninstantiable:
      local_128 = cast<wabt::AssertModuleCommand<(wabt::CommandType)6>,wabt::Command>(command_00);
      pSVar7 = std::unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>::
               operator*(&local_128->module);
      string_view::string_view((string_view *)&assert_return_command,&local_128->text);
      WriteInvalidModule(this,pSVar7,_assert_return_command);
      this->num_modules_ = this->num_modules_ + 1;
      break;
    case AssertReturn:
      assert_return_canonical_nan_command =
           (ActionCommandBase<(wabt::CommandType)8> *)
           cast<wabt::AssertReturnCommand,wabt::Command>(command_00);
      pAVar9 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                         (&((AssertReturnCommand *)assert_return_canonical_nan_command)->action);
      WriteLocation(this,&pAVar9->loc);
      WriteSeparator(this);
      pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                          (&assert_return_canonical_nan_command->action);
      WriteAction(this,pAVar10);
      WriteSeparator(this);
      WriteKey(this,"expected");
      WriteConstVector(this,(ConstVector *)(assert_return_canonical_nan_command + 1));
      break;
    case AssertReturnCanonicalNan:
      assert_return_arithmetic_nan_command =
           (ActionCommandBase<(wabt::CommandType)9> *)
           cast<wabt::ActionCommandBase<(wabt::CommandType)8>,wabt::Command>(command_00);
      pAVar9 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                         (&((ActionCommandBase<(wabt::CommandType)8> *)
                           assert_return_arithmetic_nan_command)->action);
      WriteLocation(this,&pAVar9->loc);
      WriteSeparator(this);
      pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                          (&assert_return_arithmetic_nan_command->action);
      WriteAction(this,pAVar10);
      WriteSeparator(this);
      WriteKey(this,"expected");
      pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                          (&assert_return_arithmetic_nan_command->action);
      WriteActionResultType(this,pAVar10);
      break;
    case AssertReturnArithmeticNan:
      assert_trap_command =
           (AssertTrapCommandBase<(wabt::CommandType)10> *)
           cast<wabt::ActionCommandBase<(wabt::CommandType)9>,wabt::Command>(command_00);
      pAVar9 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                         (&assert_trap_command->action);
      WriteLocation(this,&pAVar9->loc);
      WriteSeparator(this);
      pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                          (&assert_trap_command->action);
      WriteAction(this,pAVar10);
      WriteSeparator(this);
      WriteKey(this,"expected");
      pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                          (&assert_trap_command->action);
      WriteActionResultType(this,pAVar10);
      break;
    case AssertTrap:
      local_158 = cast<wabt::AssertTrapCommandBase<(wabt::CommandType)10>,wabt::Command>(command_00)
      ;
      pAVar9 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                         (&local_158->action);
      WriteLocation(this,&pAVar9->loc);
      WriteSeparator(this);
      pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                          (&local_158->action);
      WriteAction(this,pAVar10);
      WriteSeparator(this);
      WriteKey(this,"text");
      string_view::string_view((string_view *)&assert_exhaustion_command,&local_158->text);
      WriteEscapedString(this,_assert_exhaustion_command);
      WriteSeparator(this);
      WriteKey(this,"expected");
      pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                          (&local_158->action);
      WriteActionResultType(this,pAVar10);
      break;
    case AssertExhaustion:
      pAVar8 = cast<wabt::AssertTrapCommandBase<(wabt::CommandType)11>,wabt::Command>(command_00);
      pAVar9 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator->
                         (&pAVar8->action);
      WriteLocation(this,&pAVar9->loc);
      WriteSeparator(this);
      pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                          (&pAVar8->action);
      WriteAction(this,pAVar10);
      WriteSeparator(this);
      WriteKey(this,"expected");
      pAVar10 = std::unique_ptr<wabt::Action,_std::default_delete<wabt::Action>_>::operator*
                          (&pAVar8->action);
      WriteActionResultType(this,pAVar10);
    }
    Stream::Writef(this->json_stream_,"}");
    command = (Command *)((long)&command->_vptr_Command + 1);
  } while( true );
}

Assistant:

void BinaryWriterSpec::WriteCommands() {
  json_stream_->Writef("{\"source_filename\": ");
  WriteEscapedString(source_filename_);
  json_stream_->Writef(",\n \"commands\": [\n");
  Index last_module_index = kInvalidIndex;
  for (size_t i = 0; i < script_->commands.size(); ++i) {
    const Command* command = script_->commands[i].get();

    if (i != 0) {
      WriteSeparator();
      json_stream_->Writef("\n");
    }

    json_stream_->Writef("  {");
    WriteCommandType(*command);
    WriteSeparator();

    switch (command->type) {
      case CommandType::Module: {
        const Module& module = cast<ModuleCommand>(command)->module;
        std::string filename = GetModuleFilename(kWasmExtension);
        WriteLocation(module.loc);
        WriteSeparator();
        if (!module.name.empty()) {
          WriteKey("name");
          WriteEscapedString(module.name);
          WriteSeparator();
        }
        WriteKey("filename");
        WriteEscapedString(GetBasename(filename));
        WriteModule(filename, module);
        num_modules_++;
        last_module_index = i;
        break;
      }

      case CommandType::Action: {
        const Action& action = *cast<ActionCommand>(command)->action;
        WriteLocation(action.loc);
        WriteSeparator();
        WriteAction(action);
        WriteSeparator();
        WriteKey("expected");
        WriteActionResultType(action);
        break;
      }

      case CommandType::Register: {
        auto* register_command = cast<RegisterCommand>(command);
        const Var& var = register_command->var;
        WriteLocation(var.loc);
        WriteSeparator();
        if (var.is_name()) {
          WriteKey("name");
          WriteVar(var);
          WriteSeparator();
        } else {
          /* If we're not registering by name, then we should only be
           * registering the last module. */
          WABT_USE(last_module_index);
          assert(var.index() == last_module_index);
        }
        WriteKey("as");
        WriteEscapedString(register_command->module_name);
        break;
      }

      case CommandType::AssertMalformed: {
        auto* assert_malformed_command = cast<AssertMalformedCommand>(command);
        WriteInvalidModule(*assert_malformed_command->module,
                           assert_malformed_command->text);
        num_modules_++;
        break;
      }

      case CommandType::AssertInvalid: {
        auto* assert_invalid_command = cast<AssertInvalidCommand>(command);
        WriteInvalidModule(*assert_invalid_command->module,
                           assert_invalid_command->text);
        num_modules_++;
        break;
      }

      case CommandType::AssertUnlinkable: {
        auto* assert_unlinkable_command =
            cast<AssertUnlinkableCommand>(command);
        WriteInvalidModule(*assert_unlinkable_command->module,
                           assert_unlinkable_command->text);
        num_modules_++;
        break;
      }

      case CommandType::AssertUninstantiable: {
        auto* assert_uninstantiable_command =
            cast<AssertUninstantiableCommand>(command);
        WriteInvalidModule(*assert_uninstantiable_command->module,
                           assert_uninstantiable_command->text);
        num_modules_++;
        break;
      }

      case CommandType::AssertReturn: {
        auto* assert_return_command = cast<AssertReturnCommand>(command);
        WriteLocation(assert_return_command->action->loc);
        WriteSeparator();
        WriteAction(*assert_return_command->action);
        WriteSeparator();
        WriteKey("expected");
        WriteConstVector(assert_return_command->expected);
        break;
      }

      case CommandType::AssertReturnCanonicalNan: {
        auto* assert_return_canonical_nan_command =
            cast<AssertReturnCanonicalNanCommand>(command);
        WriteLocation(assert_return_canonical_nan_command->action->loc);
        WriteSeparator();
        WriteAction(*assert_return_canonical_nan_command->action);
        WriteSeparator();
        WriteKey("expected");
        WriteActionResultType(*assert_return_canonical_nan_command->action);
        break;
      }

      case CommandType::AssertReturnArithmeticNan: {
        auto* assert_return_arithmetic_nan_command =
            cast<AssertReturnArithmeticNanCommand>(command);
        WriteLocation(assert_return_arithmetic_nan_command->action->loc);
        WriteSeparator();
        WriteAction(*assert_return_arithmetic_nan_command->action);
        WriteSeparator();
        WriteKey("expected");
        WriteActionResultType(*assert_return_arithmetic_nan_command->action);
        break;
      }

      case CommandType::AssertTrap: {
        auto* assert_trap_command = cast<AssertTrapCommand>(command);
        WriteLocation(assert_trap_command->action->loc);
        WriteSeparator();
        WriteAction(*assert_trap_command->action);
        WriteSeparator();
        WriteKey("text");
        WriteEscapedString(assert_trap_command->text);
        WriteSeparator();
        WriteKey("expected");
        WriteActionResultType(*assert_trap_command->action);
        break;
      }

      case CommandType::AssertExhaustion: {
        auto* assert_exhaustion_command =
            cast<AssertExhaustionCommand>(command);
        WriteLocation(assert_exhaustion_command->action->loc);
        WriteSeparator();
        WriteAction(*assert_exhaustion_command->action);
        WriteSeparator();
        WriteKey("expected");
        WriteActionResultType(*assert_exhaustion_command->action);
        break;
      }
    }

    json_stream_->Writef("}");
  }
  json_stream_->Writef("]}\n");
}